

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoder.c
# Opt level: O0

int av1_copy_reference_enc(AV1_COMP *cpi,int idx,YV12_BUFFER_CONFIG *sd)

{
  YV12_BUFFER_CONFIG *pYVar1;
  int in_ESI;
  long in_RDI;
  YV12_BUFFER_CONFIG *cfg;
  YV12_BUFFER_CONFIG *in_stack_00000008;
  int num_planes;
  AV1_COMMON *cm;
  undefined4 local_4;
  
  av1_num_planes((AV1_COMMON *)(in_RDI + 0x3bf80));
  pYVar1 = get_ref_frame((AV1_COMMON *)(in_RDI + 0x3bf80),in_ESI);
  if (pYVar1 == (YV12_BUFFER_CONFIG *)0x0) {
    local_4 = -1;
  }
  else {
    aom_yv12_copy_frame_c((YV12_BUFFER_CONFIG *)cm,in_stack_00000008,cfg._4_4_);
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int av1_copy_reference_enc(AV1_COMP *cpi, int idx, YV12_BUFFER_CONFIG *sd) {
  AV1_COMMON *const cm = &cpi->common;
  const int num_planes = av1_num_planes(cm);
  YV12_BUFFER_CONFIG *cfg = get_ref_frame(cm, idx);
  if (cfg) {
    aom_yv12_copy_frame(cfg, sd, num_planes);
    return 0;
  } else {
    return -1;
  }
}